

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_compressBlock_btlazy2_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int *iEnd;
  undefined8 *puVar1;
  uint uVar2;
  ZSTD_matchState_t *pZVar3;
  undefined8 uVar4;
  BYTE *pBVar5;
  seqStore_t *psVar6;
  uint uVar7;
  U32 UVar8;
  U32 UVar9;
  size_t sVar10;
  size_t sVar11;
  ulong uVar12;
  BYTE *pBVar13;
  int *piVar14;
  int *piVar15;
  ulong uVar16;
  int *piVar17;
  int *piVar18;
  BYTE *pBVar19;
  long lVar20;
  BYTE *pBVar21;
  seqDef *psVar22;
  uint local_d0;
  uint local_cc;
  size_t local_b8;
  size_t offsetFound;
  uint local_a4;
  BYTE *local_a0;
  int *local_98;
  BYTE *local_90;
  int *local_88;
  int *local_80;
  BYTE *local_78;
  int *local_70;
  int *local_68;
  ZSTD_matchState_t *local_60;
  U32 local_54;
  BYTE *local_50;
  BYTE *local_48;
  seqStore_t *local_40;
  uint *local_38;
  
  local_a0 = (ms->window).base;
  uVar2 = (ms->window).dictLimit;
  local_90 = local_a0 + uVar2;
  local_cc = *rep;
  pZVar3 = ms->dictMatchState;
  local_88 = (int *)(pZVar3->window).nextSrc;
  local_78 = (pZVar3->window).base;
  local_50 = local_78 + (pZVar3->window).dictLimit;
  uVar7 = ((int)src - ((int)local_90 + (int)local_50)) + (int)local_88;
  local_60 = ms;
  if (uVar7 < local_cc) {
    __assert_fail("offset_1 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x417a,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  local_d0 = rep[1];
  local_40 = seqStore;
  local_38 = rep;
  if (uVar7 < local_d0) {
    __assert_fail("offset_2 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x417b,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  iEnd = (int *)((long)src + srcSize);
  local_70 = (int *)((long)src + (srcSize - 8));
  local_a4 = ((int)local_78 - (int)local_88) + uVar2;
  piVar17 = (int *)((long)src + (ulong)(uVar7 == 0));
  local_48 = local_78 + -(ulong)local_a4;
  local_68 = iEnd + -8;
  piVar14 = (int *)src;
  pBVar19 = local_a0;
  do {
    while( true ) {
      local_98 = piVar14;
      if (local_70 <= piVar17) {
        *local_38 = local_cc;
        local_38[1] = local_d0;
        return (long)iEnd - (long)local_98;
      }
      uVar7 = (((int)piVar17 - (int)pBVar19) - local_cc) + 1;
      piVar14 = (int *)(pBVar19 + uVar7);
      if (uVar7 < uVar2) {
        piVar14 = (int *)(local_78 + (uVar7 - local_a4));
      }
      if ((uVar7 - uVar2 < 0xfffffffd) && (*piVar14 == *(int *)((long)piVar17 + 1))) {
        piVar15 = iEnd;
        if (uVar7 < uVar2) {
          piVar15 = local_88;
        }
        sVar10 = ZSTD_count_2segments
                           ((BYTE *)((long)piVar17 + 5),(BYTE *)(piVar14 + 1),(BYTE *)iEnd,
                            (BYTE *)piVar15,local_90);
        uVar16 = sVar10 + 4;
      }
      else {
        uVar16 = 0;
      }
      offsetFound = 999999999;
      sVar10 = ZSTD_BtFindBestMatch_dictMatchState_selectMLS
                         (local_60,(BYTE *)piVar17,(BYTE *)iEnd,&offsetFound);
      uVar12 = uVar16;
      if (uVar16 < sVar10) {
        uVar12 = sVar10;
      }
      if (3 < uVar12) break;
      piVar17 = (int *)((long)piVar17 + ((long)piVar17 - (long)local_98 >> 8) + 1);
      piVar14 = local_98;
    }
    piVar14 = piVar17;
    sVar11 = offsetFound;
    if (sVar10 <= uVar16) {
      piVar14 = (int *)((long)piVar17 + 1);
      sVar11 = 0;
    }
    while (sVar10 = uVar12, local_b8 = sVar11, piVar18 = piVar17, piVar15 = piVar14,
          piVar18 < local_70) {
      piVar17 = (int *)((long)piVar18 + 1);
      uVar7 = ((int)piVar17 - (int)pBVar19) - local_cc;
      piVar15 = (int *)(pBVar19 + uVar7);
      if (uVar7 < uVar2) {
        piVar15 = (int *)(local_78 + (uVar7 - local_a4));
      }
      local_80 = piVar14;
      if ((uVar7 - uVar2 < 0xfffffffd) && (*piVar15 == *piVar17)) {
        piVar14 = iEnd;
        if (uVar7 < uVar2) {
          piVar14 = local_88;
        }
        sVar11 = ZSTD_count_2segments
                           ((BYTE *)((long)piVar18 + 5),(BYTE *)(piVar15 + 1),(BYTE *)iEnd,
                            (BYTE *)piVar14,local_90);
        UVar8 = ZSTD_highbit32((int)local_b8 + 1);
        if ((sVar11 < 0xfffffffffffffffc) &&
           ((int)(((int)sVar10 * 3 - UVar8) + 1) < (int)(sVar11 + 4) * 3)) {
          local_b8 = 0;
          sVar10 = sVar11 + 4;
          local_80 = piVar17;
        }
      }
      offsetFound = 999999999;
      uVar12 = ZSTD_BtFindBestMatch_dictMatchState_selectMLS
                         (local_60,(BYTE *)piVar17,(BYTE *)iEnd,&offsetFound);
      sVar11 = offsetFound;
      UVar8 = ZSTD_highbit32((int)offsetFound + 1);
      local_54 = (int)local_b8 + 1;
      UVar9 = ZSTD_highbit32(local_54);
      pBVar19 = local_a0;
      if ((uVar12 < 4) ||
         (piVar14 = piVar17, (int)((int)uVar12 * 4 - UVar8) <= (int)(((int)sVar10 * 4 - UVar9) + 4))
         ) {
        piVar15 = local_80;
        if (local_70 <= piVar17) break;
        piVar14 = (int *)((long)piVar18 + 2);
        uVar7 = ((int)piVar14 - (int)local_a0) - local_cc;
        piVar17 = (int *)(local_a0 + uVar7);
        if (uVar7 < uVar2) {
          piVar17 = (int *)(local_78 + (uVar7 - local_a4));
        }
        if ((uVar7 - uVar2 < 0xfffffffd) && (*piVar17 == *piVar14)) {
          piVar15 = iEnd;
          if (uVar7 < uVar2) {
            piVar15 = local_88;
          }
          sVar11 = ZSTD_count_2segments
                             ((BYTE *)((long)piVar18 + 6),(BYTE *)(piVar17 + 1),(BYTE *)iEnd,
                              (BYTE *)piVar15,local_90);
          UVar8 = ZSTD_highbit32(local_54);
          if ((sVar11 < 0xfffffffffffffffc) &&
             ((int)(((int)sVar10 * 4 + 1) - UVar8) < (int)(sVar11 + 4) * 4)) {
            local_b8 = 0;
            sVar10 = sVar11 + 4;
            local_80 = piVar14;
          }
        }
        offsetFound = 999999999;
        uVar12 = ZSTD_BtFindBestMatch_dictMatchState_selectMLS
                           (local_60,(BYTE *)piVar14,(BYTE *)iEnd,&offsetFound);
        sVar11 = offsetFound;
        UVar8 = ZSTD_highbit32((int)offsetFound + 1);
        UVar9 = ZSTD_highbit32((int)local_b8 + 1);
        piVar15 = local_80;
        pBVar19 = local_a0;
        if ((uVar12 < 4) ||
           (piVar17 = piVar14,
           (int)((int)uVar12 * 4 - UVar8) <= (int)(((int)sVar10 * 4 - UVar9) + 7))) break;
      }
    }
    psVar6 = local_40;
    pBVar5 = local_48;
    if (local_b8 == 0) {
      UVar8 = 1;
    }
    else {
      pBVar13 = (BYTE *)((long)piVar15 + (-0xfffffffe - (long)(pBVar19 + local_b8)));
      pBVar21 = local_90;
      if ((uint)pBVar13 < uVar2) {
        pBVar19 = local_48;
        pBVar21 = local_50;
      }
      pBVar19 = pBVar19 + ((ulong)pBVar13 & 0xffffffff);
      for (; ((local_98 < piVar15 && (pBVar21 < pBVar19)) &&
             (*(BYTE *)((long)piVar15 + -1) == pBVar19[-1])); piVar15 = (int *)((long)piVar15 + -1))
      {
        pBVar19 = pBVar19 + -1;
        sVar10 = sVar10 + 1;
      }
      UVar8 = (int)local_b8 + 1;
      local_d0 = local_cc;
      local_cc = (int)local_b8 - 2;
    }
    if (local_40->maxNbSeq <=
        (ulong)((long)local_40->sequences - (long)local_40->sequencesStart >> 3)) {
LAB_00132705:
      __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x2038,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (0x20000 < local_40->maxNbLit) {
LAB_00132724:
      __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x203a,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    uVar16 = (long)piVar15 - (long)local_98;
    pBVar19 = local_40->lit;
    if (local_40->litStart + local_40->maxNbLit < pBVar19 + uVar16) {
LAB_001326c7:
      __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x203b,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (iEnd < piVar15) {
LAB_001326e6:
      __assert_fail("literals + litLength <= litLimit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x203c,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (local_68 < piVar15) {
      ZSTD_safecopyLiterals(pBVar19,(BYTE *)local_98,(BYTE *)piVar15,(BYTE *)local_68);
LAB_00132434:
      psVar6->lit = psVar6->lit + uVar16;
      if (0xffff < uVar16) {
        if (psVar6->longLengthID != 0) {
          __assert_fail("seqStorePtr->longLengthID == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x204d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        psVar6->longLengthID = 1;
        psVar6->longLengthPos =
             (U32)((ulong)((long)psVar6->sequences - (long)psVar6->sequencesStart) >> 3);
      }
    }
    else {
      uVar4 = *(undefined8 *)(local_98 + 2);
      *(undefined8 *)pBVar19 = *(undefined8 *)local_98;
      *(undefined8 *)(pBVar19 + 8) = uVar4;
      pBVar19 = local_40->lit;
      if (0x10 < uVar16) {
        lVar20 = (long)(pBVar19 + 0x10) - (long)(local_98 + 4);
        if (lVar20 < 8) {
          if (-0x10 < lVar20) {
            __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x1268,
                          "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                         );
          }
        }
        else if (0xffffffffffffffe0 < lVar20 - 0x10U) {
          __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x1270,
                        "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)")
          ;
        }
        uVar4 = *(undefined8 *)(local_98 + 6);
        *(undefined8 *)(pBVar19 + 0x10) = *(undefined8 *)(local_98 + 4);
        *(undefined8 *)(pBVar19 + 0x18) = uVar4;
        if (0x20 < (long)uVar16) {
          lVar20 = 0;
          do {
            puVar1 = (undefined8 *)((long)local_98 + lVar20 + 0x20);
            uVar4 = puVar1[1];
            pBVar21 = pBVar19 + lVar20 + 0x20;
            *(undefined8 *)pBVar21 = *puVar1;
            *(undefined8 *)(pBVar21 + 8) = uVar4;
            puVar1 = (undefined8 *)((long)local_98 + lVar20 + 0x30);
            uVar4 = puVar1[1];
            *(undefined8 *)(pBVar21 + 0x10) = *puVar1;
            *(undefined8 *)(pBVar21 + 0x18) = uVar4;
            lVar20 = lVar20 + 0x20;
          } while (pBVar21 + 0x20 < pBVar19 + uVar16);
        }
        goto LAB_00132434;
      }
      local_40->lit = pBVar19 + uVar16;
    }
    pBVar19 = local_a0;
    psVar22 = psVar6->sequences;
    psVar22->litLength = (U16)uVar16;
    psVar22->offset = UVar8;
    if (0xffff < sVar10 - 3) {
      if (psVar6->longLengthID != 0) {
LAB_00132743:
        __assert_fail("seqStorePtr->longLengthID == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x2058,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      psVar6->longLengthID = 2;
      psVar6->longLengthPos = (U32)((ulong)((long)psVar22 - (long)psVar6->sequencesStart) >> 3);
    }
    psVar22->matchLength = (U16)(sVar10 - 3);
    psVar22 = psVar22 + 1;
    psVar6->sequences = psVar22;
    uVar7 = local_d0;
    for (piVar17 = (int *)((long)piVar15 + sVar10); local_d0 = uVar7, piVar14 = piVar17,
        piVar17 <= local_70; piVar17 = (int *)((long)piVar17 + sVar10 + 4)) {
      uVar7 = ((int)piVar17 - (int)pBVar19) - local_d0;
      pBVar21 = pBVar19;
      if (uVar7 < uVar2) {
        pBVar21 = pBVar5;
      }
      if ((0xfffffffc < uVar7 - uVar2) || (*(int *)(pBVar21 + uVar7) != *piVar17)) break;
      piVar14 = iEnd;
      if (uVar7 < uVar2) {
        piVar14 = local_88;
      }
      sVar10 = ZSTD_count_2segments
                         ((BYTE *)(piVar17 + 1),(BYTE *)((long)(pBVar21 + uVar7) + 4),(BYTE *)iEnd,
                          (BYTE *)piVar14,local_90);
      if (psVar6->maxNbSeq <= (ulong)((long)psVar22 - (long)psVar6->sequencesStart >> 3))
      goto LAB_00132705;
      if (0x20000 < psVar6->maxNbLit) goto LAB_00132724;
      pBVar21 = psVar6->lit;
      if (psVar6->litStart + psVar6->maxNbLit < pBVar21) goto LAB_001326c7;
      if (iEnd < piVar17) goto LAB_001326e6;
      if (local_68 < piVar17) {
        ZSTD_safecopyLiterals(pBVar21,(BYTE *)piVar17,(BYTE *)piVar17,(BYTE *)local_68);
      }
      else {
        uVar4 = *(undefined8 *)(piVar17 + 2);
        *(undefined8 *)pBVar21 = *(undefined8 *)piVar17;
        *(undefined8 *)(pBVar21 + 8) = uVar4;
      }
      psVar22 = psVar6->sequences;
      psVar22->litLength = 0;
      psVar22->offset = 1;
      if (0xffff < sVar10 + 1) {
        if (psVar6->longLengthID != 0) goto LAB_00132743;
        psVar6->longLengthID = 2;
        psVar6->longLengthPos = (U32)((ulong)((long)psVar22 - (long)psVar6->sequencesStart) >> 3);
      }
      psVar22->matchLength = (U16)(sVar10 + 1);
      psVar22 = psVar22 + 1;
      psVar6->sequences = psVar22;
      uVar7 = local_cc;
      local_cc = local_d0;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_btlazy2_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_binaryTree, 2, ZSTD_dictMatchState);
}